

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  uint32_t uVar1;
  string *psVar2;
  Nonnull<const_char_*> pcVar3;
  void *v1;
  void *v2;
  SwapFieldHelper local_40 [16];
  
  v1 = (void *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v1 & 1) != 0) {
    v1 = *(void **)((ulong)v1 & 0xfffffffffffffffe);
  }
  v2 = (void *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v2 & 1) != 0) {
    v2 = *(void **)((ulong)v2 & 0xfffffffffffffffe);
  }
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  psVar2 = (string *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  Reflection::MutableRawImpl(r,rhs,field);
  this = &r->schema_;
  uVar1 = ReflectionSchema::InlinedStringIndex(this,field);
  if (uVar1 == 0) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    SwapInlinedStrings<true>();
    goto LAB_00faec9d;
  }
  if ((r->schema_).inlined_string_donated_offset_ == -1) {
    SwapInlinedStrings<true>(local_40);
LAB_00faec72:
    SwapInlinedStrings<true>(local_40);
LAB_00faec7c:
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,v2,"lhs_arena == rhs_arena");
  }
  else {
    ReflectionSchema::InlinedStringDonatedOffset(this);
    if ((r->schema_).inlined_string_donated_offset_ == -1) goto LAB_00faec72;
    ReflectionSchema::InlinedStringDonatedOffset(this);
    if (v1 != v2) goto LAB_00faec7c;
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    std::__cxx11::string::swap(psVar2);
    return;
  }
LAB_00faec9d:
  SwapInlinedStrings<true>();
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}